

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_handle_bKGD(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  byte bVar1;
  uint uVar2;
  png_colorp ppVar3;
  int iVar4;
  png_uint_16 *ppVar5;
  png_uint_32 pVar6;
  png_uint_16 *ppVar7;
  ushort uVar8;
  png_uint_16 pVar9;
  png_uint_16 pVar10;
  char *error_message;
  png_color_16 local_20;
  png_byte buf [6];
  
  uVar2 = png_ptr->mode;
  if ((uVar2 & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if (((uVar2 & 4) != 0) ||
     (bVar1 = png_ptr->color_type, (char)((uVar2 & 2) >> 1) == '\0' && bVar1 == 3)) {
    png_crc_finish(png_ptr,length);
    error_message = "out of place";
LAB_002845a4:
    png_chunk_benign_error(png_ptr,error_message);
    return;
  }
  if ((info_ptr != (png_inforp)0x0) && ((info_ptr->valid & 0x20) != 0)) {
    png_crc_finish(png_ptr,length);
    error_message = "duplicate";
    goto LAB_002845a4;
  }
  pVar6 = 1;
  if (bVar1 != 3) {
    pVar6 = (uint)((bVar1 & 2) >> 1) * 4 + 2;
  }
  if (pVar6 != length) {
    png_crc_finish(png_ptr,length);
    error_message = "invalid";
    goto LAB_002845a4;
  }
  png_crc_read(png_ptr,buf,length);
  iVar4 = png_crc_finish(png_ptr,0);
  if (iVar4 != 0) {
    return;
  }
  ppVar5 = &local_20.gray;
  if (png_ptr->color_type == 3) {
    local_20.index = buf[0];
    if ((info_ptr == (png_inforp)0x0) || (info_ptr->num_palette == 0)) {
      local_20.green = 0;
      local_20.blue = 0;
      pVar9 = 0;
      ppVar7 = &local_20.red;
      pVar10 = 0;
      goto LAB_002846f1;
    }
    uVar8 = buf._0_2_ & 0xff;
    if (info_ptr->num_palette <= uVar8) {
      png_chunk_benign_error(png_ptr,"invalid index");
      return;
    }
    ppVar3 = png_ptr->palette;
    local_20.green = (png_uint_16)ppVar3[uVar8].green;
    pVar10 = (png_uint_16)ppVar3[uVar8].blue;
    local_20.red = (ushort)ppVar3[uVar8].red;
  }
  else {
    pVar9 = buf._0_2_ << 8 | (ushort)buf._0_2_ >> 8;
    local_20.index = '\0';
    if ((png_ptr->color_type & 2) == 0) {
      ppVar7 = &local_20.green;
      local_20.blue = pVar9;
      ppVar5 = &local_20.red;
      local_20.gray = pVar9;
      pVar10 = pVar9;
      goto LAB_002846f1;
    }
    local_20.green = buf._2_2_ << 8 | (ushort)buf._2_2_ >> 8;
    pVar10 = buf._4_2_ << 8 | (ushort)buf._4_2_ >> 8;
    local_20.red = pVar9;
  }
  ppVar7 = &local_20.blue;
  pVar9 = pVar10;
  pVar10 = 0;
LAB_002846f1:
  *ppVar7 = pVar9;
  *ppVar5 = pVar10;
  png_set_bKGD(png_ptr,info_ptr,&local_20);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_bKGD(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   unsigned int truelen;
   png_byte buf[6];
   png_color_16 background;

   png_debug(1, "in png_handle_bKGD");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0 ||
       (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE &&
       (png_ptr->mode & PNG_HAVE_PLTE) == 0))
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_bKGD) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
      truelen = 1;

   else if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) != 0)
      truelen = 6;

   else
      truelen = 2;

   if (length != truelen)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, truelen);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   /* We convert the index value into RGB components so that we can allow
    * arbitrary RGB values for background when we have transparency, and
    * so it is easy to determine the RGB values of the background color
    * from the info_ptr struct.
    */
   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
   {
      background.index = buf[0];

      if (info_ptr != NULL && info_ptr->num_palette != 0)
      {
         if (buf[0] >= info_ptr->num_palette)
         {
            png_chunk_benign_error(png_ptr, "invalid index");
            return;
         }

         background.red = (png_uint_16)png_ptr->palette[buf[0]].red;
         background.green = (png_uint_16)png_ptr->palette[buf[0]].green;
         background.blue = (png_uint_16)png_ptr->palette[buf[0]].blue;
      }

      else
         background.red = background.green = background.blue = 0;

      background.gray = 0;
   }

   else if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) == 0) /* GRAY */
   {
      background.index = 0;
      background.red =
      background.green =
      background.blue =
      background.gray = png_get_uint_16(buf);
   }

   else
   {
      background.index = 0;
      background.red = png_get_uint_16(buf);
      background.green = png_get_uint_16(buf + 2);
      background.blue = png_get_uint_16(buf + 4);
      background.gray = 0;
   }

   png_set_bKGD(png_ptr, info_ptr, &background);
}